

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

void __thiscall cppcms::http::context::async_complete_response(context *this)

{
  connection *this_00;
  response *response;
  io_mode_type iVar1;
  callback<void_(cppcms::http::context::completion_type)> local_60;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  ct_to_bool local_38;
  
  http::response::finalize
            ((((this->d).ptr_)->response)._M_t.
             super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
             .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
  iVar1 = http::response::io_mode
                    ((((this->d).ptr_)->response)._M_t.
                     super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                     .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
  if (iVar1 != asynchronous) {
    iVar1 = http::response::io_mode
                      ((((this->d).ptr_)->response)._M_t.
                       super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                       .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
    if (iVar1 != asynchronous_raw) {
      complete_response(this);
      return;
    }
  }
  local_58._0_8_ = try_restart;
  local_58._8_8_ = 0;
  std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::http::context,void>
            ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10),
             (__weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *)this);
  this_00 = (this->conn_).
            super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  response = (((this->d).ptr_)->response)._M_t.
             super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
             .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl;
  anon_unknown_3::ct_to_bool::ct_to_bool(&local_38,(ct_to_bool *)local_58);
  booster::callback<void_(cppcms::http::context::completion_type)>::
  callback<cppcms::http::(anonymous_namespace)::ct_to_bool>(&local_60,&local_38);
  cppcms::impl::cgi::connection::async_write_response(this_00,response,true,&local_60);
  booster::intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>::
  ~intrusive_ptr(&local_60.call_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.ctx.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  return;
}

Assistant:

void context::async_complete_response()
{
	response().finalize();
	if(response().io_mode() == http::response::asynchronous || response().io_mode() == http::response::asynchronous_raw) {
		ct_to_bool cb = { &context::try_restart, self() };
		conn_->async_write_response(
			response(),
			true,
			cb);
		return;
	}
	complete_response();
}